

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  locale_ref lVar1;
  big_decimal_fp *pbVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  type tVar6;
  type tVar7;
  int iVar8;
  appender aVar9;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint value;
  digit_grouping<char> *this;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  sign_t sVar18;
  undefined5 uStack_128;
  char local_123;
  sign_t sign;
  char zero;
  bool pointy;
  undefined3 uStack_11f;
  int significand_size;
  ulong local_118;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_110;
  undefined8 local_108;
  format_specs<char> *local_100;
  locale_ref local_f8;
  ulong local_f0;
  char *significand;
  int local_e0;
  int exp;
  char *local_d8;
  float_specs fspecs_local;
  anon_class_40_8_dbbf3351 write;
  digit_grouping<char> grouping;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = f->significand;
  iVar8 = f->significand_size;
  zero = '0';
  sVar18 = fspecs._5_1_;
  sign = sVar18;
  significand_size = iVar8;
  local_110 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_108 = f;
  local_100 = specs;
  local_d8 = significand;
  fspecs_local = fspecs;
  tVar6 = to_unsigned<int>(iVar8);
  local_118 = (ulong)((tVar6 + 1) - (uint)(sVar18 == none));
  cVar4 = '.';
  local_f0 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    lVar1.locale_._5_1_ = local_123;
    lVar1.locale_._0_5_ = uStack_128;
    lVar1.locale_._6_1_ = sign;
    lVar1.locale_._7_1_ = zero;
    cVar4 = decimal_point_impl<char>(lVar1);
  }
  pbVar2 = local_108;
  iVar17 = local_108->exponent;
  local_e0 = iVar17 + iVar8 + -1;
  local_123 = cVar4;
  local_f8.locale_ = loc.locale_;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_e0;
  bVar5 = do_write_float<fmt::v10::appender,_fmt::v10::detail::big_decimal_fp,_char,_fmt::v10::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar15 = local_118;
  uVar14 = fspecs.precision;
  uVar11 = (uint)local_f0;
  if (bVar5) {
    iVar17 = iVar17 + iVar8;
    if ((uVar11 >> 0x13 & 1) == 0) {
      local_108 = (big_decimal_fp *)((ulong)local_108._4_4_ << 0x20);
      if (iVar8 == 1) {
        cVar4 = '\0';
      }
    }
    else {
      iVar13 = 0;
      if (0 < (int)(uVar14 - iVar8)) {
        iVar13 = uVar14 - iVar8;
      }
      local_108 = (big_decimal_fp *)CONCAT44(local_108._4_4_,iVar13);
      tVar6 = to_unsigned<int>(iVar13);
      uVar15 = local_118 + tVar6;
    }
    iVar3 = local_e0;
    iVar13 = 1 - iVar17;
    if (0 < iVar17) {
      iVar13 = local_e0;
    }
    iVar17 = 2;
    if (99 < iVar13) {
      iVar17 = (999 < iVar13) + 3;
    }
    tVar6 = to_unsigned<int>((3 - (uint)(cVar4 == '\0')) + iVar17);
    write.sign = sVar18;
    write.significand = local_d8;
    write.decimal_point = cVar4;
    write.significand_size = iVar8;
    write._24_5_ = CONCAT14('0',(int)local_108);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar11 >> 0x10 & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = iVar3;
    if (0 < local_100->width) {
      aVar9 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                        ((appender)local_110.container,local_100,uVar15 + tVar6,&write);
      return (appender)
             aVar9.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    aVar9 = do_write_float<fmt::v10::appender,_fmt::v10::detail::big_decimal_fp,_char,_fmt::v10::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()(&write,(iterator)local_110.container);
    return (appender)
           aVar9.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  iVar13 = pbVar2->exponent;
  iVar17 = iVar13 + iVar8;
  exp = iVar17;
  if (-1 < iVar13) {
    tVar6 = to_unsigned<int>(iVar13);
    lVar1.locale_ = local_f8.locale_;
    lVar16 = tVar6 + local_118;
    _pointy = uVar14 - iVar17;
    uVar11 = (uint)local_f0;
    if ((uVar11 >> 0x13 & 1) != 0) {
      lVar16 = lVar16 + 1;
      if ((char)local_f0 == '\x02' || 0 < (int)_pointy) {
        if (0 < (int)_pointy) {
          tVar6 = to_unsigned<int>(_pointy);
          lVar16 = lVar16 + (ulong)tVar6;
        }
      }
      else {
        _pointy = 0;
      }
    }
    digit_grouping<char>::digit_grouping(&grouping,lVar1,(bool)((byte)(uVar11 >> 0x11) & 1));
    iVar8 = digit_grouping<char>::count_separators(&grouping,iVar17);
    tVar6 = to_unsigned<int>(iVar8);
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = local_108;
    write._32_8_ = &grouping;
    bVar10.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>
                   (local_110.container,local_100,lVar16 + (ulong)tVar6,
                    (anon_class_72_9_0c6a3a8a *)&write);
    this = &grouping;
LAB_001d2e3a:
    digit_grouping<char>::~digit_grouping(this);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar10.container;
  }
  if (0 < iVar17) {
    _pointy = uVar14 - iVar8 & (int)(uVar11 << 0xc) >> 0x1f;
    uVar14 = _pointy;
    if ((int)_pointy < 1) {
      uVar14 = 0;
    }
    tVar6 = to_unsigned<int>(uVar14);
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&write,local_f8,(bool)((byte)(uVar11 >> 0x11) & 1));
    iVar8 = digit_grouping<char>::count_separators((digit_grouping<char> *)&write,iVar17);
    tVar7 = to_unsigned<int>(iVar8);
    grouping.grouping_._M_dataplus._M_p = (pointer)&sign;
    grouping.grouping_._M_string_length = (size_type)&significand;
    grouping.grouping_.field_2._M_allocated_capacity = (size_type)&significand_size;
    grouping.grouping_.field_2._8_8_ = &exp;
    grouping.thousands_sep_._M_dataplus._M_p = &local_123;
    grouping.thousands_sep_.field_2._M_allocated_capacity = (size_type)&pointy;
    grouping.thousands_sep_.field_2._8_8_ = &zero;
    grouping.thousands_sep_._M_string_length = (size_type)&write;
    bVar10.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>
                   (local_110.container,local_100,local_118 + tVar7 + (ulong)(tVar6 + 1),
                    (anon_class_64_8_e6ffa566 *)&grouping);
    this = (digit_grouping<char> *)&write;
    goto LAB_001d2e3a;
  }
  uVar12 = -iVar17;
  value = uVar12;
  if (uVar14 < uVar12) {
    value = uVar14;
  }
  if ((int)uVar14 < 0) {
    value = uVar12;
  }
  if (iVar8 != 0) {
    value = uVar12;
  }
  grouping.grouping_._M_dataplus._M_p._0_4_ = value;
  if (iVar8 == 0 && value == 0) {
    _pointy = CONCAT31(uStack_11f,(char)((uVar11 & 0x80000) >> 0x13));
    if ((local_f0 & 0x80000) == 0) {
      iVar8 = 1;
      goto LAB_001d2e91;
    }
  }
  else {
    _pointy = CONCAT31(uStack_11f,1);
  }
  iVar8 = 2;
LAB_001d2e91:
  tVar6 = to_unsigned<int>(value);
  write._0_8_ = &sign;
  write.significand = &zero;
  write._16_8_ = &pointy;
  write._24_8_ = &local_123;
  write._32_8_ = &grouping;
  aVar9 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>
                    ((appender)local_110.container,local_100,(iVar8 + tVar6) + uVar15,
                     (anon_class_56_7_162c6e41 *)&write);
  return (appender)
         aVar9.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}